

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen_engine.h
# Opt level: O0

void __thiscall
absl::lts_20250127::random_internal::randen_engine<unsigned_long>::seed
          (randen_engine<unsigned_long> *this,result_type_conflict seed_value)

{
  int local_24;
  result_type_conflict *local_20;
  result_type_conflict *begin;
  result_type_conflict seed_value_local;
  randen_engine<unsigned_long> *this_local;
  
  this->next_ = 0x20;
  begin = (result_type_conflict *)seed_value;
  seed_value_local = (result_type_conflict)this;
  local_20 = state(this);
  local_24 = 0;
  std::fill<unsigned_long*,int>(local_20,local_20 + 2,&local_24);
  std::fill<unsigned_long*,unsigned_long>(local_20 + 2,local_20 + 0x20,(unsigned_long *)&begin);
  return;
}

Assistant:

void seed(result_type seed_value = 0) {
    next_ = kStateSizeT;
    // Zeroes the inner state and fills the outer state with seed_value to
    // mimic the behaviour of reseed
    auto* begin = state();
    std::fill(begin, begin + kCapacityT, 0);
    std::fill(begin + kCapacityT, begin + kStateSizeT, seed_value);
  }